

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O2

int __thiscall ncnn::Gemm_x86_avx512::create_pipeline_int8(Gemm_x86_avx512 *this,Option *opt)

{
  Mat *pMVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint K;
  Allocator *pAVar4;
  size_t sVar5;
  int max_ii;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  undefined1 (*pauVar12) [32];
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  void *pvVar16;
  undefined8 *puVar17;
  long lVar18;
  long lVar19;
  Gemm_x86_avx512 *pGVar20;
  undefined1 *puVar21;
  Gemm_x86_avx512 *pGVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  undefined1 (*pauVar31) [32];
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_ZMM1 [64];
  long local_110;
  long local_100;
  long local_f0;
  long local_e8;
  long local_d8;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  long local_b8;
  Gemm_x86_avx512 *local_b0;
  Mat local_a8;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Option *local_38;
  
  pGVar20 = this;
  local_b0 = this;
  local_38 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_0045220e:
    pGVar22 = pGVar20;
    if ((pGVar20->super_Gemm).constantB != 0) {
      uVar3 = (pGVar20->super_Gemm).constantN;
      K = (pGVar20->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar3,K,(pGVar20->super_Gemm).constant_TILE_M,
                 (pGVar20->super_Gemm).constant_TILE_N,(pGVar20->super_Gemm).constant_TILE_K,&TILE_M
                 ,&TILE_N,&TILE_K,opt->num_threads);
      iVar8 = TILE_K;
      iVar7 = (int)(uVar3 + TILE_N + -1) / TILE_N;
      local_60 = (ulong)uVar3;
      local_48 = (ulong)K;
      Mat::create(&pGVar20->BT_data,TILE_N * TILE_K,(int)(K + TILE_K + -1) / TILE_K,iVar7,1,
                  (Allocator *)0x0);
      if (((pGVar20->BT_data).data == (void *)0x0) ||
         ((long)(pGVar20->BT_data).c * (pGVar20->BT_data).cstep == 0)) goto LAB_00452c5a;
      pMVar1 = &(pGVar20->super_Gemm).B_data;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      for (iVar11 = 0; opt = local_38, iVar11 != iVar7; iVar11 = iVar11 + 1) {
        local_50 = CONCAT44(local_50._4_4_,(int)local_60 - TILE_N * iVar11);
        uVar24 = (ulong)(TILE_N * iVar11);
        local_b8 = uVar24 + 1;
        local_58 = uVar24;
        for (iVar23 = 0; iVar35 = (int)local_48 - iVar23, iVar35 != 0 && iVar23 <= (int)local_48;
            iVar23 = iVar23 + TILE_K) {
          iVar6 = (int)local_50;
          if (TILE_N < (int)local_50) {
            iVar6 = TILE_N;
          }
          if (iVar8 < iVar35) {
            iVar35 = iVar8;
          }
          iVar36 = (int)uVar24;
          local_a8.elemsize = (pGVar22->BT_data).elemsize;
          local_a8.w = (pGVar22->BT_data).w;
          local_a8.cstep = (size_t)local_a8.w;
          local_a8.elempack = (pGVar22->BT_data).elempack;
          local_a8.allocator = (pGVar22->BT_data).allocator;
          local_a8.data =
               (void *)((long)(pGVar22->BT_data).data +
                       local_a8.elemsize * local_a8.cstep * (long)(iVar23 / iVar8) +
                       (long)(int)((long)((ulong)(uint)(iVar36 >> 0x1f) << 0x20 |
                                         uVar24 & 0xffffffff) / (long)TILE_N) *
                       (pGVar22->BT_data).cstep * local_a8.elemsize);
          local_a8.refcount = (int *)0x0;
          local_a8.dims = 2;
          local_a8.h = 1;
          local_a8.d = 1;
          local_a8.c = 1;
          lVar18 = (long)iVar23;
          lVar30 = (long)iVar6;
          if ((pGVar22->super_Gemm).transB == 0) {
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            iVar8 = cpu_support_x86_avx512_vnni();
            if (iVar8 == 0) {
              iVar8 = cpu_support_x86_avx_vnni_int8();
              if (iVar8 == 0) {
                iVar8 = cpu_support_x86_avx_vnni();
                if (iVar8 == 0) {
                  iVar8 = (pGVar22->super_Gemm).B_data.w;
                  lVar9 = (long)iVar8;
                  lVar13 = (long)(iVar8 * 2);
                  lVar33 = uVar24 + lVar9;
                  local_e8 = (long)(iVar8 + 3) + uVar24;
                  local_d8 = (long)(iVar8 + 2) + uVar24;
                  local_100 = (long)(iVar8 + 1) + uVar24;
                  pauVar12 = (undefined1 (*) [32])local_a8.data;
                  local_f0 = local_b8;
                  for (uVar27 = 0; (long)(uVar27 | 0xf) < lVar30; uVar27 = uVar27 + 0x10) {
                    lVar14 = (pGVar22->super_Gemm).B_data.w * lVar18 *
                             (pGVar22->super_Gemm).B_data.elemsize;
                    pvVar16 = (pGVar22->super_Gemm).B_data.data;
                    lVar29 = (long)pvVar16 + uVar24;
                    lVar37 = (long)pvVar16 + lVar33;
                    for (iVar8 = 0; iVar8 + 1 < iVar35; iVar8 = iVar8 + 2) {
                      auVar42 = *(undefined1 (*) [16])(lVar37 + lVar14);
                      in_ZMM1 = ZEXT1664(auVar42);
                      auVar46 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar29 + lVar14),auVar42);
                      auVar42 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar29 + lVar14),auVar42);
                      *(undefined1 (*) [16])*pauVar12 = auVar46;
                      *(undefined1 (*) [16])(*pauVar12 + 0x10) = auVar42;
                      pauVar12 = pauVar12 + 1;
                      lVar29 = lVar29 + lVar13;
                      lVar37 = lVar37 + lVar13;
                    }
                    pauVar15 = (undefined1 (*) [16])(lVar29 + lVar14);
                    for (; iVar8 < iVar35; iVar8 = iVar8 + 1) {
                      *(undefined1 (*) [16])*pauVar12 = *pauVar15;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                      pauVar15 = (undefined1 (*) [16])(*pauVar15 + lVar9);
                    }
                    uVar24 = uVar24 + 0x10;
                    lVar33 = lVar33 + 0x10;
                    local_e8 = local_e8 + 0x10;
                    local_d8 = local_d8 + 0x10;
                    local_100 = local_100 + 0x10;
                    local_f0 = local_f0 + 0x10;
                    pGVar22 = local_b0;
                  }
                  for (; (long)(uVar27 | 7) < lVar30; uVar27 = uVar27 + 8) {
                    pvVar16 = (void *)((pGVar22->super_Gemm).B_data.w * lVar18 *
                                       (pGVar22->super_Gemm).B_data.elemsize +
                                      (long)(pGVar22->super_Gemm).B_data.data);
                    for (iVar8 = 0; iVar8 + 1 < iVar35; iVar8 = iVar8 + 2) {
                      in_ZMM1 = ZEXT864(*(ulong *)((long)pvVar16 + lVar33));
                      auVar45._8_8_ = 0;
                      auVar45._0_8_ = *(ulong *)((long)pvVar16 + uVar24);
                      auVar47._8_8_ = 0;
                      auVar47._0_8_ = *(ulong *)((long)pvVar16 + lVar33);
                      auVar42 = vpunpcklbw_avx(auVar45,auVar47);
                      *(undefined1 (*) [16])*pauVar12 = auVar42;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                      pvVar16 = (void *)((long)pvVar16 + lVar13);
                    }
                    puVar17 = (undefined8 *)((long)pvVar16 + uVar24);
                    for (; iVar8 < iVar35; iVar8 = iVar8 + 1) {
                      *(undefined8 *)*pauVar12 = *puVar17;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                      puVar17 = (undefined8 *)((long)puVar17 + lVar9);
                    }
                    uVar24 = uVar24 + 8;
                    lVar33 = lVar33 + 8;
                    local_e8 = local_e8 + 8;
                    local_d8 = local_d8 + 8;
                    local_100 = local_100 + 8;
                    local_f0 = local_f0 + 8;
                  }
                  while (uVar38 = uVar27, (long)(uVar38 | 3) < lVar30) {
                    pvVar16 = (pGVar22->super_Gemm).B_data.data;
                    lVar34 = (pGVar22->super_Gemm).B_data.w * lVar18 *
                             (pGVar22->super_Gemm).B_data.elemsize;
                    lVar29 = uVar24 + (long)pvVar16;
                    lVar37 = local_e8 + (long)pvVar16;
                    lVar32 = (long)pvVar16 + local_d8;
                    lVar14 = local_100 + (long)pvVar16;
                    lVar19 = lVar33 + (long)pvVar16;
                    puVar21 = (undefined1 *)((long)pvVar16 + lVar34 + local_f0);
                    for (iVar8 = 1; iVar8 < iVar35; iVar8 = iVar8 + 2) {
                      (*pauVar12)[0] = *(undefined1 *)(lVar29 + lVar34);
                      (*pauVar12)[1] = *(undefined1 *)(lVar19 + lVar34);
                      (*pauVar12)[2] = *(undefined1 *)(lVar29 + 1 + lVar34);
                      (*pauVar12)[3] = *(undefined1 *)(lVar14 + lVar34);
                      (*pauVar12)[4] = *(undefined1 *)(lVar29 + 2 + lVar34);
                      (*pauVar12)[5] = *(undefined1 *)(lVar32 + lVar34);
                      (*pauVar12)[6] = *(undefined1 *)(lVar29 + 3 + lVar34);
                      (*pauVar12)[7] = *(undefined1 *)(lVar37 + lVar34);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                      lVar29 = lVar29 + lVar13;
                      lVar37 = lVar37 + lVar13;
                      lVar32 = lVar32 + lVar13;
                      lVar14 = lVar14 + lVar13;
                      lVar19 = lVar19 + lVar13;
                      puVar21 = puVar21 + lVar13;
                    }
                    for (iVar8 = iVar8 + -1; iVar8 < iVar35; iVar8 = iVar8 + 1) {
                      (*pauVar12)[0] = puVar21[-1];
                      (*pauVar12)[1] = *puVar21;
                      (*pauVar12)[2] = puVar21[1];
                      (*pauVar12)[3] = puVar21[2];
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                      puVar21 = puVar21 + lVar9;
                    }
                    uVar24 = uVar24 + 4;
                    local_e8 = local_e8 + 4;
                    local_d8 = local_d8 + 4;
                    local_100 = local_100 + 4;
                    lVar33 = lVar33 + 4;
                    local_f0 = local_f0 + 4;
                    pGVar22 = local_b0;
                    local_40 = uVar38;
                    uVar27 = uVar38 + 4;
                  }
                  for (; (long)(uVar38 | 1) < lVar30; uVar38 = uVar38 + 2) {
                    pvVar16 = (pGVar22->super_Gemm).B_data.data;
                    lVar14 = (pGVar22->super_Gemm).B_data.w * lVar18 *
                             (pGVar22->super_Gemm).B_data.elemsize;
                    lVar29 = (long)pvVar16 + uVar24;
                    lVar19 = local_100 + (long)pvVar16;
                    lVar37 = (long)pvVar16 + lVar33;
                    for (iVar8 = 1; iVar8 < iVar35; iVar8 = iVar8 + 2) {
                      (*pauVar12)[0] = *(undefined1 *)(lVar29 + lVar14);
                      (*pauVar12)[1] = *(undefined1 *)(lVar37 + lVar14);
                      (*pauVar12)[2] = *(undefined1 *)(lVar29 + 1 + lVar14);
                      (*pauVar12)[3] = *(undefined1 *)(lVar19 + lVar14);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                      lVar29 = lVar29 + lVar13;
                      lVar19 = lVar19 + lVar13;
                      lVar37 = lVar37 + lVar13;
                    }
                    for (iVar8 = iVar8 + -1; iVar8 < iVar35; iVar8 = iVar8 + 1) {
                      (*pauVar12)[0] = *(undefined1 *)(lVar29 + lVar14);
                      (*pauVar12)[1] = *(undefined1 *)(lVar29 + 1 + lVar14);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 2);
                      lVar14 = lVar14 + lVar9;
                    }
                    uVar24 = uVar24 + 2;
                    local_100 = local_100 + 2;
                    lVar33 = lVar33 + 2;
                  }
                  if (iVar35 < 1) {
                    iVar35 = 0;
                  }
                  for (; uVar24 = local_58, (long)uVar38 < lVar30; uVar38 = uVar38 + 1) {
                    puVar21 = (undefined1 *)
                              ((long)(pGVar22->super_Gemm).B_data.data +
                              local_58 +
                              uVar38 + (pGVar22->super_Gemm).B_data.w * lVar18 *
                                       (pGVar22->super_Gemm).B_data.elemsize);
                    iVar8 = iVar35;
                    while (bVar41 = iVar8 != 0, iVar8 = iVar8 + -1, bVar41) {
                      (*pauVar12)[0] = *puVar21;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 1);
                      puVar21 = puVar21 + lVar9;
                    }
                  }
                }
                else {
                  transpose_pack_B_tile_int8_avxvnni(pMVar1,&local_a8,iVar36,iVar6,iVar23,iVar35);
                }
              }
              else {
                transpose_pack_B_tile_int8_avxvnniint8(pMVar1,&local_a8,iVar36,iVar6,iVar23,iVar35);
              }
            }
            else {
              transpose_pack_B_tile_int8_avx512vnni(pMVar1,&local_a8,iVar36,iVar6,iVar23,iVar35);
            }
          }
          else {
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            iVar8 = cpu_support_x86_avx512_vnni();
            if (iVar8 == 0) {
              iVar8 = cpu_support_x86_avx_vnni_int8();
              if (iVar8 == 0) {
                iVar8 = cpu_support_x86_avx_vnni();
                if (iVar8 == 0) {
                  uVar27 = uVar24;
                  pauVar12 = (undefined1 (*) [32])local_a8.data;
                  lVar33 = local_b8;
                  for (uVar38 = 0; (long)(uVar38 | 0xf) < lVar30; uVar38 = uVar38 + 0x10) {
                    auVar44 = vpbroadcastd_avx512f();
                    vpmulld_avx512f(auVar44,_DAT_0055cf80);
                    pvVar16 = (pGVar22->super_Gemm).B_data.data;
                    lVar9 = (pGVar22->super_Gemm).B_data.elemsize * uVar27 *
                            (long)(pGVar22->super_Gemm).B_data.w + lVar18;
                    for (lVar13 = 0; (int)lVar13 + 1 < iVar35; lVar13 = lVar13 + 2) {
                      in_ZMM1 = vpgatherdd_avx512f(*(undefined4 *)
                                                    ((long)pvVar16 + uVar27 + lVar13 + lVar9));
                      auVar43 = vpmovdw_avx512f(in_ZMM1);
                      *pauVar12 = auVar43;
                      pauVar12 = pauVar12 + 1;
                    }
                    for (; (int)lVar13 < iVar35; lVar13 = lVar13 + 1) {
                      in_ZMM1 = vpgatherdd_avx512f(*(undefined4 *)
                                                    ((long)pvVar16 + uVar27 + lVar13 + lVar9));
                      auVar42 = vpmovdb_avx512f(in_ZMM1);
                      *(undefined1 (*) [16])*pauVar12 = auVar42;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                    }
                    uVar27 = uVar27 + 0x10;
                    lVar33 = lVar33 + 0x10;
                  }
                  for (; (long)(uVar38 | 7) < lVar30; uVar38 = uVar38 + 8) {
                    auVar43 = vpbroadcastd_avx512vl();
                    vpmulld_avx2(auVar43,_DAT_00553600);
                    for (iVar8 = 0; iVar8 + 1 < iVar35; iVar8 = iVar8 + 2) {
                      auVar43 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
                      auVar43 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar43);
                      in_ZMM1 = ZEXT3264((undefined1  [32])0x0);
                      auVar42 = vpmovdw_avx512vl(auVar43);
                      *(undefined1 (*) [16])*pauVar12 = auVar42;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                    }
                    for (; iVar8 < iVar35; iVar8 = iVar8 + 1) {
                      auVar43 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
                      auVar43 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar43);
                      in_ZMM1 = ZEXT3264((undefined1  [32])0x0);
                      auVar42 = vpmovdb_avx512vl(auVar43);
                      *(long *)*pauVar12 = auVar42._0_8_;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                    }
                    uVar27 = uVar27 + 8;
                    lVar33 = lVar33 + 8;
                  }
                  for (; (long)(uVar38 | 3) < lVar30; uVar38 = uVar38 + 4) {
                    auVar42 = vpbroadcastd_avx512vl();
                    vpmulld_avx(auVar42,_DAT_005522b0);
                    for (iVar8 = 0; iVar8 + 1 < iVar35; iVar8 = iVar8 + 2) {
                      auVar42 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
                      auVar42 = vpgatherdd((undefined1  [16])0x0,auVar42);
                      in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
                      auVar42 = vpmovdw_avx512vl(auVar42);
                      *(long *)*pauVar12 = auVar42._0_8_;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                    }
                    for (; iVar8 < iVar35; iVar8 = iVar8 + 1) {
                      auVar42 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
                      auVar42 = vpgatherdd((undefined1  [16])0x0,auVar42);
                      in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
                      auVar42 = vpmovdb_avx512vl(auVar42);
                      *(int *)*pauVar12 = auVar42._0_4_;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                    }
                    uVar27 = uVar27 + 4;
                    lVar33 = lVar33 + 4;
                  }
                  for (; (long)(uVar38 | 1) < lVar30; uVar38 = uVar38 + 2) {
                    sVar5 = (pGVar22->super_Gemm).B_data.elemsize;
                    lVar13 = (long)(pGVar22->super_Gemm).B_data.w;
                    pvVar16 = (pGVar22->super_Gemm).B_data.data;
                    lVar9 = sVar5 * uVar27 * lVar13 + lVar18;
                    lVar13 = sVar5 * lVar33 * lVar13 + lVar18;
                    pauVar31 = pauVar12;
                    for (lVar29 = 0; (int)lVar29 + 1 < iVar35; lVar29 = lVar29 + 2) {
                      (*pauVar12)[lVar29 * 2] = *(undefined1 *)((long)pvVar16 + lVar29 + lVar9);
                      (*pauVar12)[lVar29 * 2 + 1] =
                           *(undefined1 *)((long)pvVar16 + lVar29 + lVar9 + 1);
                      (*pauVar12)[lVar29 * 2 + 2] = *(undefined1 *)((long)pvVar16 + lVar29 + lVar13)
                      ;
                      (*pauVar12)[lVar29 * 2 + 3] =
                           *(undefined1 *)((long)pvVar16 + lVar29 + lVar13 + 1);
                      pauVar31 = (undefined1 (*) [32])(*pauVar31 + 4);
                    }
                    for (; pauVar12 = pauVar31, (int)lVar29 < iVar35; lVar29 = lVar29 + 1) {
                      (*pauVar12)[0] = *(undefined1 *)((long)pvVar16 + lVar29 + lVar9);
                      (*pauVar12)[1] = *(undefined1 *)((long)pvVar16 + lVar29 + lVar13);
                      pauVar31 = (undefined1 (*) [32])(*pauVar12 + 2);
                    }
                    uVar27 = uVar27 + 2;
                    lVar33 = lVar33 + 2;
                  }
                  if (iVar35 < 1) {
                    iVar35 = 0;
                  }
                  for (; (long)uVar38 < lVar30; uVar38 = uVar38 + 1) {
                    iVar8 = (pGVar22->super_Gemm).B_data.w;
                    pvVar16 = (pGVar22->super_Gemm).B_data.data;
                    sVar5 = (pGVar22->super_Gemm).B_data.elemsize;
                    for (lVar33 = 0; iVar35 != (int)lVar33; lVar33 = lVar33 + 1) {
                      (*pauVar12)[lVar33] =
                           *(undefined1 *)
                            ((long)pvVar16 + lVar33 + sVar5 * uVar27 * (long)iVar8 + lVar18);
                    }
                    pauVar12 = (undefined1 (*) [32])(*pauVar12 + lVar33);
                    uVar27 = uVar27 + 1;
                  }
                }
                else {
                  pack_B_tile_int8_avxvnni(pMVar1,&local_a8,iVar36,iVar6,iVar23,iVar35);
                }
              }
              else {
                pack_B_tile_int8_avxvnniint8(pMVar1,&local_a8,iVar36,iVar6,iVar23,iVar35);
              }
            }
            else {
              pack_B_tile_int8_avx512vnni(pMVar1,&local_a8,iVar36,iVar6,iVar23,iVar35);
            }
          }
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + -1;
            UNLOCK();
            if (*local_a8.refcount == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                free(local_a8.data);
              }
              else {
                in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
                (*(local_a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar8 = TILE_K;
        }
      }
      if (local_38->lightmode != false) {
        piVar10 = (pGVar22->super_Gemm).B_data.refcount;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            pAVar4 = (pGVar22->super_Gemm).B_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              free((pGVar22->super_Gemm).B_data.data);
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (pGVar22->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(pGVar20->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (pGVar22->super_Gemm).B_data.dims = 0;
        (pGVar22->super_Gemm).B_data.w = 0;
        (pGVar22->super_Gemm).B_data.h = 0;
        (pGVar22->super_Gemm).B_data.d = 0;
        (pGVar22->super_Gemm).B_data.c = 0;
      }
    }
    if (((pGVar22->super_Gemm).constantC != 0) &&
       ((pGVar22->super_Gemm).constant_broadcast_type_C != -1)) {
      piVar10 = (pGVar22->super_Gemm).C_data.refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      piVar10 = (pGVar22->CT_data).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pAVar4 = (pGVar22->CT_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            free((pGVar22->CT_data).data);
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      auVar2._0_8_ = (pGVar22->super_Gemm).C_data.data;
      auVar2._8_8_ = (pGVar22->super_Gemm).C_data.refcount;
      (pGVar22->CT_data).data = (void *)auVar2._0_8_;
      (pGVar22->CT_data).refcount = (int *)auVar2._8_8_;
      (pGVar22->CT_data).elemsize = (pGVar22->super_Gemm).C_data.elemsize;
      (pGVar22->CT_data).elempack = (pGVar22->super_Gemm).C_data.elempack;
      (pGVar22->CT_data).allocator = (pGVar22->super_Gemm).C_data.allocator;
      iVar8 = (pGVar22->super_Gemm).C_data.w;
      iVar7 = (pGVar22->super_Gemm).C_data.h;
      iVar11 = (pGVar22->super_Gemm).C_data.d;
      (pGVar22->CT_data).dims = (pGVar22->super_Gemm).C_data.dims;
      (pGVar22->CT_data).w = iVar8;
      (pGVar22->CT_data).h = iVar7;
      (pGVar22->CT_data).d = iVar11;
      (pGVar22->CT_data).c = (pGVar22->super_Gemm).C_data.c;
      (pGVar22->CT_data).cstep = (pGVar22->super_Gemm).C_data.cstep;
      if (opt->lightmode == true) {
        piVar10 = (int *)vpextrq_avx(auVar2,1);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            pAVar4 = (pGVar22->super_Gemm).C_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              free((pGVar22->super_Gemm).C_data.data);
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (pGVar22->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(pGVar22->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (pGVar22->super_Gemm).C_data.data = (void *)0x0;
        (pGVar22->super_Gemm).C_data.refcount = (int *)0x0;
        (pGVar22->super_Gemm).C_data.dims = 0;
        (pGVar22->super_Gemm).C_data.w = 0;
        (pGVar22->super_Gemm).C_data.h = 0;
        (pGVar22->super_Gemm).C_data.d = 0;
        (pGVar22->super_Gemm).C_data.c = 0;
      }
    }
    iVar8 = 0;
    if ((((pGVar22->super_Gemm).constantA != 0) || ((pGVar22->super_Gemm).constantB != 0)) ||
       ((pGVar22->super_Gemm).constantC != 0)) {
      *(int *)&(pGVar22->super_Gemm).field_0x244 = opt->num_threads;
    }
  }
  else {
    uVar3 = (this->super_Gemm).constantM;
    iVar8 = (this->super_Gemm).constantK;
    get_optimal_tile_mnk_int8
              (uVar3,0,iVar8,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar11 = TILE_M;
    iVar7 = TILE_K;
    iVar35 = (int)(TILE_M + uVar3 + -1) / TILE_M;
    iVar23 = iVar7;
    local_60 = (ulong)uVar3;
    if (3 < TILE_K) {
      iVar6 = cpu_support_x86_avx512_vnni();
      bVar41 = true;
      if (iVar6 == 0) {
        iVar6 = cpu_support_x86_avx_vnni();
        bVar41 = iVar6 != 0;
      }
      iVar6 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar41 ^ 1U | iVar6 != 0)) {
        if (iVar11 < 0x10) {
          if (iVar11 < 8) {
            if (iVar11 < 4) {
              iVar23 = (uint)(1 < iVar11) * 4 + 4;
            }
            else {
              iVar23 = 0x10;
            }
          }
          else {
            iVar23 = 0x20;
          }
        }
        else {
          iVar23 = 0x40;
        }
        iVar23 = iVar23 + iVar7;
      }
    }
    Mat::create(&this->AT_data,iVar23 * iVar11,(iVar8 + iVar7 + -1) / iVar7,iVar35,1,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      pMVar1 = &(this->super_Gemm).A_data;
      if (iVar35 < 1) {
        iVar35 = 0;
      }
      for (iVar11 = 0; opt = local_38, iVar11 != iVar35; iVar11 = iVar11 + 1) {
        iVar23 = TILE_M * iVar11;
        local_b8 = CONCAT44(local_b8._4_4_,(int)local_60 - iVar23);
        lVar18 = (long)iVar23;
        local_58 = lVar18 + 1;
        for (iVar6 = 0; iVar36 = iVar8 - iVar6, iVar36 != 0 && iVar6 <= iVar8;
            iVar6 = iVar6 + TILE_K) {
          max_ii = (int)local_b8;
          if (TILE_M < (int)local_b8) {
            max_ii = TILE_M;
          }
          if (iVar7 < iVar36) {
            iVar36 = iVar7;
          }
          local_a8.elemsize = (pGVar20->AT_data).elemsize;
          local_a8.w = (pGVar20->AT_data).w;
          local_a8.cstep = (size_t)local_a8.w;
          local_a8.elempack = (pGVar20->AT_data).elempack;
          local_a8.allocator = (pGVar20->AT_data).allocator;
          local_a8.data =
               (void *)((long)(pGVar20->AT_data).data +
                       local_a8.elemsize * local_a8.cstep * (long)(iVar6 / iVar7) +
                       (long)(iVar23 / TILE_M) * (pGVar20->AT_data).cstep * local_a8.elemsize);
          local_a8.refcount = (int *)0x0;
          local_a8.dims = 2;
          local_a8.h = 1;
          local_a8.d = 1;
          local_a8.c = 1;
          if ((pGVar20->super_Gemm).transA == 0) {
            pack_A_tile_int8(pMVar1,&local_a8,iVar23,max_ii,iVar6,iVar36);
          }
          else {
            iVar7 = cpu_support_x86_avx512_vnni();
            if (iVar7 == 0) {
              iVar7 = cpu_support_x86_avx_vnni_int8();
              if (iVar7 == 0) {
                iVar7 = cpu_support_x86_avx_vnni();
                if (iVar7 == 0) {
                  iVar7 = (pGVar20->super_Gemm).A_data.w;
                  lVar9 = (long)iVar7;
                  lVar13 = (long)iVar6;
                  lVar29 = (long)(iVar7 * 2);
                  lVar37 = (long)max_ii;
                  lVar30 = lVar18 + lVar9;
                  uVar38 = (iVar7 + 3) + lVar18;
                  local_100 = (iVar7 + 2) + lVar18;
                  local_110 = (iVar7 + 1) + lVar18;
                  pauVar12 = (undefined1 (*) [32])local_a8.data;
                  uVar27 = local_58;
                  lVar33 = lVar18;
                  for (uVar24 = 0; (long)(uVar24 | 0xf) < lVar37; uVar24 = uVar24 + 0x10) {
                    lVar32 = (pGVar20->super_Gemm).A_data.w * lVar13 *
                             (pGVar20->super_Gemm).A_data.elemsize;
                    pvVar16 = (pGVar20->super_Gemm).A_data.data;
                    lVar14 = (long)pvVar16 + lVar33;
                    lVar19 = (long)pvVar16 + lVar30;
                    for (iVar7 = 0; iVar7 + 1 < iVar36; iVar7 = iVar7 + 2) {
                      auVar42 = *(undefined1 (*) [16])(lVar19 + lVar32);
                      in_ZMM1 = ZEXT1664(auVar42);
                      auVar46 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar14 + lVar32),auVar42);
                      auVar42 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar14 + lVar32),auVar42);
                      *(undefined1 (*) [16])*pauVar12 = auVar46;
                      *(undefined1 (*) [16])(*pauVar12 + 0x10) = auVar42;
                      pauVar12 = pauVar12 + 1;
                      lVar14 = lVar14 + lVar29;
                      lVar19 = lVar19 + lVar29;
                    }
                    pauVar15 = (undefined1 (*) [16])(lVar14 + lVar32);
                    for (; iVar7 < iVar36; iVar7 = iVar7 + 1) {
                      *(undefined1 (*) [16])*pauVar12 = *pauVar15;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                      pauVar15 = (undefined1 (*) [16])(*pauVar15 + lVar9);
                    }
                    lVar33 = lVar33 + 0x10;
                    lVar30 = lVar30 + 0x10;
                    uVar38 = uVar38 + 0x10;
                    local_100 = local_100 + 0x10;
                    local_110 = local_110 + 0x10;
                    uVar27 = uVar27 + 0x10;
                    pGVar20 = local_b0;
                  }
                  for (; (long)(uVar24 | 7) < lVar37; uVar24 = uVar24 + 8) {
                    pvVar16 = (void *)((pGVar20->super_Gemm).A_data.w * lVar13 *
                                       (pGVar20->super_Gemm).A_data.elemsize +
                                      (long)(pGVar20->super_Gemm).A_data.data);
                    for (iVar7 = 0; iVar7 + 1 < iVar36; iVar7 = iVar7 + 2) {
                      in_ZMM1 = ZEXT864(*(ulong *)((long)pvVar16 + lVar30));
                      auVar42._8_8_ = 0;
                      auVar42._0_8_ = *(ulong *)((long)pvVar16 + lVar33);
                      auVar46._8_8_ = 0;
                      auVar46._0_8_ = *(ulong *)((long)pvVar16 + lVar30);
                      auVar42 = vpunpcklbw_avx(auVar42,auVar46);
                      *(undefined1 (*) [16])*pauVar12 = auVar42;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
                      pvVar16 = (void *)((long)pvVar16 + lVar29);
                    }
                    puVar17 = (undefined8 *)((long)pvVar16 + lVar33);
                    for (; iVar7 < iVar36; iVar7 = iVar7 + 1) {
                      *(undefined8 *)*pauVar12 = *puVar17;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                      puVar17 = (undefined8 *)((long)puVar17 + lVar9);
                    }
                    lVar33 = lVar33 + 8;
                    lVar30 = lVar30 + 8;
                    uVar38 = uVar38 + 8;
                    local_100 = local_100 + 8;
                    local_110 = local_110 + 8;
                    uVar27 = uVar27 + 8;
                  }
                  while (uVar39 = uVar38, uVar28 = uVar27, uVar26 = uVar24,
                        (long)(uVar26 | 3) < lVar37) {
                    pvVar16 = (pGVar20->super_Gemm).A_data.data;
                    lVar25 = (pGVar20->super_Gemm).A_data.w * lVar13 *
                             (pGVar20->super_Gemm).A_data.elemsize;
                    lVar14 = lVar33 + (long)pvVar16;
                    lVar40 = uVar39 + (long)pvVar16;
                    lVar34 = (long)pvVar16 + local_100;
                    lVar19 = local_110 + (long)pvVar16;
                    lVar32 = lVar30 + (long)pvVar16;
                    puVar21 = (undefined1 *)((long)pvVar16 + lVar25 + uVar28);
                    for (iVar7 = 1; iVar7 < iVar36; iVar7 = iVar7 + 2) {
                      (*pauVar12)[0] = *(undefined1 *)(lVar14 + lVar25);
                      (*pauVar12)[1] = *(undefined1 *)(lVar32 + lVar25);
                      (*pauVar12)[2] = *(undefined1 *)(lVar14 + 1 + lVar25);
                      (*pauVar12)[3] = *(undefined1 *)(lVar19 + lVar25);
                      (*pauVar12)[4] = *(undefined1 *)(lVar14 + 2 + lVar25);
                      (*pauVar12)[5] = *(undefined1 *)(lVar34 + lVar25);
                      (*pauVar12)[6] = *(undefined1 *)(lVar14 + 3 + lVar25);
                      (*pauVar12)[7] = *(undefined1 *)(lVar40 + lVar25);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 8);
                      lVar14 = lVar14 + lVar29;
                      lVar40 = lVar40 + lVar29;
                      lVar34 = lVar34 + lVar29;
                      lVar19 = lVar19 + lVar29;
                      lVar32 = lVar32 + lVar29;
                      puVar21 = puVar21 + lVar29;
                    }
                    for (iVar7 = iVar7 + -1; iVar7 < iVar36; iVar7 = iVar7 + 1) {
                      (*pauVar12)[0] = puVar21[-1];
                      (*pauVar12)[1] = *puVar21;
                      (*pauVar12)[2] = puVar21[1];
                      (*pauVar12)[3] = puVar21[2];
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                      puVar21 = puVar21 + lVar9;
                    }
                    lVar33 = lVar33 + 4;
                    local_100 = local_100 + 4;
                    local_110 = local_110 + 4;
                    lVar30 = lVar30 + 4;
                    pGVar20 = local_b0;
                    uVar27 = uVar28 + 4;
                    uVar38 = uVar39 + 4;
                    local_50 = uVar28;
                    local_48 = uVar39;
                    local_40 = uVar26;
                    uVar24 = uVar26 + 4;
                  }
                  for (; (long)(uVar26 | 1) < lVar37; uVar26 = uVar26 + 2) {
                    pvVar16 = (pGVar20->super_Gemm).A_data.data;
                    lVar32 = (pGVar20->super_Gemm).A_data.w * lVar13 *
                             (pGVar20->super_Gemm).A_data.elemsize;
                    lVar14 = (long)pvVar16 + lVar33;
                    lVar19 = (long)pvVar16 + local_110;
                    lVar34 = (long)pvVar16 + lVar30;
                    for (iVar7 = 1; iVar7 < iVar36; iVar7 = iVar7 + 2) {
                      (*pauVar12)[0] = *(undefined1 *)(lVar14 + lVar32);
                      (*pauVar12)[1] = *(undefined1 *)(lVar34 + lVar32);
                      (*pauVar12)[2] = *(undefined1 *)(lVar14 + 1 + lVar32);
                      (*pauVar12)[3] = *(undefined1 *)(lVar19 + lVar32);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
                      lVar14 = lVar14 + lVar29;
                      lVar19 = lVar19 + lVar29;
                      lVar34 = lVar34 + lVar29;
                    }
                    for (iVar7 = iVar7 + -1; iVar7 < iVar36; iVar7 = iVar7 + 1) {
                      (*pauVar12)[0] = *(undefined1 *)(lVar14 + lVar32);
                      (*pauVar12)[1] = *(undefined1 *)(lVar14 + 1 + lVar32);
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 2);
                      lVar32 = lVar32 + lVar9;
                    }
                    lVar33 = lVar33 + 2;
                    local_110 = local_110 + 2;
                    lVar30 = lVar30 + 2;
                  }
                  if (iVar36 < 1) {
                    iVar36 = 0;
                  }
                  for (; (long)uVar26 < lVar37; uVar26 = uVar26 + 1) {
                    puVar21 = (undefined1 *)
                              ((long)(pGVar20->super_Gemm).A_data.data +
                              uVar26 + lVar18 +
                              (pGVar20->super_Gemm).A_data.w * lVar13 *
                              (pGVar20->super_Gemm).A_data.elemsize);
                    iVar7 = iVar36;
                    while (bVar41 = iVar7 != 0, iVar7 = iVar7 + -1, bVar41) {
                      (*pauVar12)[0] = *puVar21;
                      pauVar12 = (undefined1 (*) [32])(*pauVar12 + 1);
                      puVar21 = puVar21 + lVar9;
                    }
                  }
                }
                else {
                  transpose_pack_A_tile_int8_avxvnni(pMVar1,&local_a8,iVar23,max_ii,iVar6,iVar36);
                }
              }
              else {
                transpose_pack_A_tile_int8_avxvnniint8(pMVar1,&local_a8,iVar23,max_ii,iVar6,iVar36);
              }
            }
            else {
              transpose_pack_A_tile_int8_avx512vnni(pMVar1,&local_a8,iVar23,max_ii,iVar6,iVar36);
            }
          }
          if (local_a8.refcount != (int *)0x0) {
            LOCK();
            *local_a8.refcount = *local_a8.refcount + -1;
            UNLOCK();
            if (*local_a8.refcount == 0) {
              if (local_a8.allocator == (Allocator *)0x0) {
                free(local_a8.data);
              }
              else {
                (*(local_a8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          iVar7 = TILE_K;
        }
      }
      if (local_38->lightmode != false) {
        piVar10 = (pGVar20->super_Gemm).A_data.refcount;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            pAVar4 = (pGVar20->super_Gemm).A_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              free((pGVar20->super_Gemm).A_data.data);
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (pGVar20->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (pGVar20->super_Gemm).A_data.dims = 0;
        (pGVar20->super_Gemm).A_data.w = 0;
        (pGVar20->super_Gemm).A_data.h = 0;
        (pGVar20->super_Gemm).A_data.d = 0;
        (pGVar20->super_Gemm).A_data.c = 0;
      }
      goto LAB_0045220e;
    }
LAB_00452c5a:
    iVar8 = -100;
  }
  return iVar8;
}

Assistant:

int Gemm_x86_avx512::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}